

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_sha1.c
# Opt level: O3

void csp_sha1_process(csp_sha1_state_t *sha1,void *data,uint32_t inlen)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint8_t *in;
  
  if (inlen != 0) {
    do {
      uVar1 = sha1->curlen;
      if (inlen < 0x40 || (ulong)uVar1 != 0) {
        uVar2 = 0x40 - uVar1;
        if (inlen < 0x40 - uVar1) {
          uVar2 = inlen;
        }
        memcpy(sha1->buf + uVar1,data,(ulong)uVar2);
        uVar3 = uVar2 + sha1->curlen;
        inlen = inlen - uVar2;
        sha1->curlen = uVar3;
        data = (void *)((long)data + (ulong)uVar2);
        if (uVar3 == 0x40) {
          csp_sha1_compress(sha1,sha1->buf);
          sha1->length = sha1->length + 0x200;
          sha1->curlen = 0;
        }
      }
      else {
        csp_sha1_compress(sha1,(uint8_t *)data);
        sha1->length = sha1->length + 0x200;
        data = (void *)((long)data + 0x40);
        inlen = inlen - 0x40;
      }
    } while (inlen != 0);
  }
  return;
}

Assistant:

void csp_sha1_process(csp_sha1_state_t * sha1, const void * data, uint32_t inlen) {

	const uint8_t * in = data;
	uint32_t n;
	while (inlen > 0) {
		if (sha1->curlen == 0 && inlen >= CSP_SHA1_BLOCKSIZE) {
			csp_sha1_compress(sha1, in);
			sha1->length += (CSP_SHA1_BLOCKSIZE * 8);
			in += CSP_SHA1_BLOCKSIZE;
			inlen -= CSP_SHA1_BLOCKSIZE;
		} else {
			n = MIN(inlen, (CSP_SHA1_BLOCKSIZE - sha1->curlen));
			memcpy(sha1->buf + sha1->curlen, in, (size_t)n);
			sha1->curlen += n;
			in += n;
			inlen -= n;
			if (sha1->curlen == CSP_SHA1_BLOCKSIZE) {
				csp_sha1_compress(sha1, sha1->buf);
				sha1->length += (CSP_SHA1_BLOCKSIZE * 8);
				sha1->curlen = 0;
			}
		}
	}
}